

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::BeginRead3dmTable(ON_BinaryArchive *this,uint typecode)

{
  bool bVar1;
  undefined1 uVar2;
  archive_mode aVar3;
  bool local_139;
  ON__UINT64 min_length_data;
  ON_UUID class_uuid;
  ON__UINT32 table_record_record;
  ON__UINT64 filelength;
  bool bSeekFromStart;
  ON__INT64 OStack_38;
  bool bIsTableTypeCode;
  ON__INT64 big_value;
  bool local_25;
  ON__UINT32 tcode;
  bool bUserTable;
  ON_3dmArchiveTableType tt;
  bool rc;
  ON_BinaryArchive *pOStack_18;
  uint typecode_local;
  ON_BinaryArchive *this_local;
  
  bUserTable = false;
  tt = typecode;
  pOStack_18 = this;
  aVar3 = Mode(this);
  if (aVar3 == read3dm) {
    if (tt == Unset) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x22d6,"","ON_BinaryArchive::BeginRead3dmTable() bad typecode");
      this_local._7_1_ = false;
    }
    else {
      tcode = TableTypeFromTypecode(this,tt);
      if (tcode == Unset) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x22dd,"","ON_BinaryArchive::BeginRead3dmTable() bad typecode");
        this_local._7_1_ = false;
      }
      else {
        local_139 = tt == 0x10000017 || tcode == user_table;
        local_25 = local_139;
        if (tcode < (settings_table|start_section)) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x22e5,"",
                     "ON_BinaryArchive::BeginRead3dmTable cannot be used for start, properties, or settings table."
                    );
          this_local._7_1_ = false;
        }
        else {
          bVar1 = ArchiveContains3dmTable(this,tcode);
          if (bVar1) {
            if (this->m_3dm_version < 2) {
              bVar1 = SeekFromStart(this,0x20);
              bUserTable = (bool)(-bVar1 & 1);
              bVar1 = Begin3dmTable(this,read3dm,tcode);
              if ((bVar1) && ((bUserTable & 1U) == 0)) {
                End3dmTable(this,tcode,false);
              }
              this_local._7_1_ = (bool)(bUserTable & 1);
            }
            else {
              big_value._4_4_ = Unset;
              OStack_38 = 0;
              bUserTable = PeekAt3dmBigChunkType
                                     (this,(ON__UINT32 *)((long)&big_value + 4),
                                      &stack0xffffffffffffffc8);
              if (bUserTable) {
                if (big_value._4_4_ != tt) {
                  if ((local_25 & 1U) != 0) {
                    return false;
                  }
                  if ((big_value._4_4_ &
                      ~(dimension_style_table|leader_style_table|text_style_table|group_table|
                        layer_table|linetype_table|material_table|texture_mapping_table|bitmap_table
                        |settings_table|properties_table|start_section)) != 0x10000000) {
                    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                               ,0x2317,"","tcode is not a table typecode. File is badly corrupted.")
                    ;
                    Internal_ReportCriticalError(this);
                    return false;
                  }
                  bVar1 = true;
                  if ((((big_value._4_4_ == 0x10000022) && (tt == 0x10000021)) &&
                      (this->m_3dm_version == 3)) && (0xbf1f0c5 < this->m_3dm_opennurbs_version)) {
                    big_value._4_4_ = Unset;
                    OStack_38 = 0;
                    bVar1 = BeginRead3dmBigChunk
                                      (this,(uint *)((long)&big_value + 4),&stack0xffffffffffffffc8)
                    ;
                    if (bVar1) {
                      bVar1 = EndRead3dmChunk(this);
                      if (bVar1) {
                        OStack_38 = 0;
                      }
                      big_value._4_4_ = Unset;
                    }
                    bVar1 = false;
                  }
                  if (bVar1) {
                    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                               ,0x234b,"",
                               "ON_BinaryArchive::BeginRead3dmTable() - current file position not at start of table - searching"
                              );
                    bUserTable = Seek3dmChunkFromStart(this,tt);
                  }
                }
                if (((bUserTable & 1U) != 0) &&
                   (bUserTable = Begin3dmTable(this,read3dm,tcode), bUserTable)) {
                  big_value._4_4_ = Unset;
                  OStack_38 = 0;
                  bUserTable = BeginRead3dmBigChunk
                                         (this,(uint *)((long)&big_value + 4),
                                          &stack0xffffffffffffffc8);
                  if ((bUserTable) && (big_value._4_4_ != tt)) {
                    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                               ,0x2359,"",
                               "ON_BinaryArchive::BeginRead3dmTable() - corrupt table - skipping");
                    bUserTable = false;
                    bVar1 = EndRead3dmChunk(this);
                    if ((bVar1) && (tt + 0xeffffff0 < 0x16 || tt == 0x10000026)) {
                      uVar2 = (*(code *)(&DAT_009d6ae0 +
                                        *(int *)(&DAT_009d6ae0 + (ulong)(tt + 0xeffffff0) * 4)))();
                      return (bool)uVar2;
                    }
                  }
                  if ((bUserTable & 1U) == 0) {
                    End3dmTable(this,tcode,false);
                  }
                }
              }
              this_local._7_1_ = (bool)(bUserTable & 1);
            }
          }
          else if ((local_25 & 1U) == 0) {
            this_local._7_1_ = Begin3dmTable(this,read3dm,tcode);
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x22d0,"",
               "ON_BinaryArchive::BeginRead3dmTable() ON::archive_mode::read3dm != Mode()");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::BeginRead3dmTable( unsigned int typecode )
{
  bool rc = false;
  if (ON::archive_mode::read3dm != Mode())
  {
    ON_ERROR("ON_BinaryArchive::BeginRead3dmTable() ON::archive_mode::read3dm != Mode()");
    return false;
  }

  if (0 == typecode) 
  {
    ON_ERROR("ON_BinaryArchive::BeginRead3dmTable() bad typecode");
    return false;
  }

  const ON_3dmArchiveTableType tt = TableTypeFromTypecode(typecode);
  if (tt == ON_3dmArchiveTableType::Unset) 
  {
    ON_ERROR("ON_BinaryArchive::BeginRead3dmTable() bad typecode");
    return false;
  }

  const bool bUserTable = ( TCODE_USER_TABLE == typecode || ON_3dmArchiveTableType::user_table == tt );

  if (static_cast<unsigned int>(tt) <= static_cast<unsigned int>(ON_3dmArchiveTableType::settings_table))
  {
    ON_ERROR("ON_BinaryArchive::BeginRead3dmTable cannot be used for start, properties, or settings table.");
    return false;
  }

  if (false == ArchiveContains3dmTable(tt))
  {
    // table type was added after the code that wrote the
    // file was compiled or after this code was compiled.
    if ( bUserTable )
      return false; // false for user tables

    // true for the other tabelss if things are as they should be
    return Begin3dmTable(ON::archive_mode::read3dm,tt);
  }

  if ( m_3dm_version <= 1 ) 
  {
      // version 1 files had can have chunks in any order.  To read a "table",
      // you have to go through the entire list of chunks looking for those
      // that belong to a particular table.
      rc = SeekFromStart(32)?true:false;
      if (Begin3dmTable(ON::archive_mode::read3dm, tt))
      {
        if (false == rc)
          End3dmTable(tt, false);
      }
      return rc;
  }

  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  rc = PeekAt3dmBigChunkType( &tcode, &big_value );
  if ( rc )
  {
    if ( tcode != typecode ) 
    {
      if ( bUserTable ) 
      {
        // it's ok to not have user tables
        return false;
      }

      const bool bIsTableTypeCode = (TCODE_TABLE == (0xFFFFF000 & tcode));
      if (false == bIsTableTypeCode)
      {
        // Dale Lear - Nov 8 2022 - ships in Rhino 8.2
        // Fix https://mcneel.myjetbrains.com/youtrack/issue/RH-77657
        // (detecting corruption in table headers prevents hangs).
        // This value isn't a table typecode (even from a table added int the future).
        // The file is badly corrupt at this point and we have to quit.
        ON_ERROR("tcode is not a table typecode. File is badly corrupted.");
        this->Internal_ReportCriticalError();
        return false;
      }

      // A required table is not at the current position in the archive
      // see if we can find it someplace else in the archive.  This can
      // happen when old code encounters a table that was added later.

      bool bSeekFromStart = true;

      if (   TCODE_HATCHPATTERN_TABLE == tcode
          && TCODE_INSTANCE_DEFINITION_TABLE == typecode
          && 3 == m_3dm_version 
          && 200405190 <= m_3dm_opennurbs_version )
      {
        // Dale Lear
        //   V3 files from 19 may 2004 on contained bogus hatch pattern tables
        //   where the instance definition table was supposed to be.
        //
        // Do not set rc in this code.  The goal of this code is to
        // avoid seeking from the start of the file and posting
        // an ON_ERROR alert about something we can work around
        // and has been fixed in V4.
        bSeekFromStart = false;
        tcode = 0;
        big_value = 0;
        if (BeginRead3dmBigChunk(&tcode, &big_value))
        {
          if (EndRead3dmChunk())
          {
            tcode = 0;
            big_value = 0;
            if (TCODE_HATCHPATTERN_TABLE == tcode)
            {
              // We've skipped the incorrectly positioned hatch pattern table.
              // If we're lucking we are at the start of the correct table.
              PeekAt3dmBigChunkType(&tcode, &big_value);
              if (tcode != typecode)
              {
                // We're not lucky.
                bSeekFromStart = true;
              }
            }
          }
          else
            tcode = 0;            
        }
      }

      if ( bSeekFromStart )
      {
        ON_ERROR("ON_BinaryArchive::BeginRead3dmTable() - current file position not at start of table - searching");
        rc = Seek3dmChunkFromStart( typecode );
      }
    }
    if ( rc ) 
    {
      rc = Begin3dmTable(ON::archive_mode::read3dm,tt);
      if (rc)
      {
        tcode = 0;
        big_value = 0;
        rc = BeginRead3dmBigChunk(&tcode, &big_value);
        if (rc && tcode != typecode)
        {
          ON_ERROR("ON_BinaryArchive::BeginRead3dmTable() - corrupt table - skipping");
          rc = false;
          if (EndRead3dmChunk())
          {
            // 1 November 2005 Dale Lear
            //    This fall back is slow but it has been finding
            //    layer and object tables in damaged files.  I'm
            //    adding it to the other BeginRead3dm...Table()
            //    functions when it makes sense.

            ON__UINT64 filelength = 0;
            ON__UINT32 table_record_record = 0;
            ON_UUID class_uuid = ON_nil_uuid;
            ON__UINT64 min_length_data = 0;
            switch (typecode)
            {
            case TCODE_BITMAP_TABLE:
              table_record_record = TCODE_BITMAP_RECORD;
              class_uuid = ON_nil_uuid;  // multiple types of opennurbs objects in bitmap tables
              min_length_data = 40;
              break;

            case TCODE_TEXTURE_MAPPING_TABLE:
              table_record_record = TCODE_TEXTURE_MAPPING_RECORD;
              class_uuid = ON_CLASS_ID(ON_TextureMapping);
              min_length_data = sizeof(ON_TextureMapping);
              break;

            case TCODE_MATERIAL_TABLE:
              table_record_record = TCODE_MATERIAL_RECORD;
              class_uuid = ON_CLASS_ID(ON_Material);
              min_length_data = 114;
              break;

            case TCODE_LINETYPE_TABLE:
              table_record_record = TCODE_LINETYPE_RECORD;
              class_uuid = ON_CLASS_ID(ON_Linetype);
              min_length_data = 20;
              break;

            case TCODE_LAYER_TABLE:
              table_record_record = TCODE_LAYER_RECORD;
              class_uuid = ON_CLASS_ID(ON_Layer);
              min_length_data = 30;
              break;

            case TCODE_GROUP_TABLE:
              table_record_record = TCODE_GROUP_RECORD;
              class_uuid = ON_CLASS_ID(ON_Group);
              min_length_data = 20;
              break;

            case TCODE_FONT_TABLE:
              table_record_record = TCODE_FONT_RECORD;
              class_uuid = ON_CLASS_ID(ON_TextStyle);
              min_length_data = 30;
              break;

            case TCODE_DIMSTYLE_TABLE:
              table_record_record = TCODE_DIMSTYLE_RECORD;
              class_uuid 
                = (m_3dm_version >= 60)
                ? ON_CLASS_ID(ON_DimStyle)
                : ON_CLASS_ID(ON_V5x_DimStyle);
              min_length_data = 30;
              break;

            case TCODE_LIGHT_TABLE:
              table_record_record = TCODE_LIGHT_RECORD;
              class_uuid = ON_CLASS_ID(ON_Light);
              min_length_data = 30;
              break;

            case TCODE_HATCHPATTERN_TABLE:
              table_record_record = TCODE_HATCHPATTERN_RECORD;
              class_uuid = ON_CLASS_ID(ON_HatchPattern);
              min_length_data = 30;
              break;

            case TCODE_INSTANCE_DEFINITION_TABLE:
              table_record_record = TCODE_INSTANCE_DEFINITION_RECORD;
              class_uuid = ON_CLASS_ID(ON_InstanceDefinition);
              min_length_data = 30;
              break;

            case TCODE_OBJECT_TABLE:
              table_record_record = TCODE_OBJECT_RECORD;
              class_uuid = ON_nil_uuid; // multiple object types in this table
              min_length_data = 26; // ON_Point data is 3 doubles + 2 byte version number
              break;

            case TCODE_HISTORYRECORD_TABLE:
              table_record_record = TCODE_HISTORYRECORD_RECORD;
              class_uuid = ON_CLASS_ID(ON_HistoryRecord);
              min_length_data = sizeof(ON_HistoryRecord);
              break;

            default:
              break;
            }

            if (
              0 != table_record_record 
              && min_length_data > 0 
              )
            {
              if ( FindMisplacedTable(filelength, typecode, table_record_record, class_uuid, min_length_data) )
              {
                tcode = 0;
                big_value = 0;
                if (PeekAt3dmBigChunkType(&tcode, &big_value))
                {
                  if (tcode == typecode)
                  {
                    // try one last time
                    End3dmTable(tt,true);
                    m_3dm_previous_table = ON_3dmArchiveTableType::settings_table;
                    rc = Begin3dmTable(ON::archive_mode::read3dm, tt);
                    if (rc)
                    {
                      tcode = 0;
                      big_value = 0;
                      rc = BeginRead3dmBigChunk(&tcode, &big_value);
                      if (rc)
                      {
                        if (tcode != typecode)
                        {
                          EndRead3dmChunk();
                          rc = false;
                          End3dmTable(tt, false);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if ( false == rc )
          End3dmTable(tt,false);
      }
    }
  }
  
  return rc;
}